

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int skip_trellis_opt_based_on_satd
              (MACROBLOCK *x,QUANT_PARAM *quant_param,int plane,int block,TX_SIZE tx_size,
              int quant_b_adapt,int qstep,uint coeff_opt_satd_threshold,int skip_trellis,
              int dc_only_blk)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  tran_low_t *ptVar5;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  byte in_R8B;
  int skip_block_trellis;
  int satd;
  int shift;
  int n_coeffs;
  tran_low_t *coeff_ptr;
  int in_stack_00000020;
  int block_offset;
  macroblock_plane *p;
  uint local_4;
  
  if (((uint)coeff_ptr == 0) && (shift != -1)) {
    ptVar5 = (tran_low_t *)
             (*(long *)(in_RDI + (long)in_EDX * 0x88 + 0x18) + (long)(in_ECX << 4) * 4);
    iVar2 = av1_get_max_eob(in_R8B);
    iVar3 = av1_get_tx_scale(in_R8B);
    if (in_stack_00000020 == 0) {
      iVar2 = (*aom_satd)(ptVar5,iVar2);
    }
    else {
      iVar2 = *ptVar5;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
    }
    bVar1 = (byte)(1 - iVar3);
    if (1 - iVar3 < 0) {
      iVar3 = iVar2 << (-bVar1 & 0x1f);
    }
    else {
      iVar3 = iVar2 >> (bVar1 & 0x1f);
    }
    iVar4 = iVar3 >> ((char)*(undefined4 *)(in_RDI + 0x2b40) - 8U & 0x1f);
    local_4 = (uint)((ulong)(uint)shift * (long)skip_block_trellis * (long)sqrt_tx_pixels_2d[in_R8B]
                    < (ulong)(long)iVar4);
    av1_setup_quant((TX_SIZE)((uint)iVar4 >> 0x18),local_4,iVar2,iVar3,(QUANT_PARAM *)0x13954a2);
  }
  else {
    local_4 = (uint)coeff_ptr;
  }
  return local_4;
}

Assistant:

static int skip_trellis_opt_based_on_satd(MACROBLOCK *x,
                                          QUANT_PARAM *quant_param, int plane,
                                          int block, TX_SIZE tx_size,
                                          int quant_b_adapt, int qstep,
                                          unsigned int coeff_opt_satd_threshold,
                                          int skip_trellis, int dc_only_blk) {
  if (skip_trellis || (coeff_opt_satd_threshold == UINT_MAX))
    return skip_trellis;

  const struct macroblock_plane *const p = &x->plane[plane];
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *const coeff_ptr = p->coeff + block_offset;
  const int n_coeffs = av1_get_max_eob(tx_size);
  const int shift = (MAX_TX_SCALE - av1_get_tx_scale(tx_size));
  int satd = (dc_only_blk) ? abs(coeff_ptr[0]) : aom_satd(coeff_ptr, n_coeffs);
  satd = RIGHT_SIGNED_SHIFT(satd, shift);
  satd >>= (x->e_mbd.bd - 8);

  const int skip_block_trellis =
      ((uint64_t)satd >
       (uint64_t)coeff_opt_satd_threshold * qstep * sqrt_tx_pixels_2d[tx_size]);

  av1_setup_quant(
      tx_size, !skip_block_trellis,
      skip_block_trellis
          ? (USE_B_QUANT_NO_TRELLIS ? AV1_XFORM_QUANT_B : AV1_XFORM_QUANT_FP)
          : AV1_XFORM_QUANT_FP,
      quant_b_adapt, quant_param);

  return skip_block_trellis;
}